

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::GrammarResolver::orphanGrammar(GrammarResolver *this,XMLCh *nameSpaceKey)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GrammarResolver *local_28;
  Grammar *grammar;
  XMLCh *nameSpaceKey_local;
  GrammarResolver *this_local;
  
  if ((this->fCacheGrammar & 1U) == 0) {
    this_local = (GrammarResolver *)
                 RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                           (this->fGrammarBucket,nameSpaceKey);
  }
  else {
    iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[4])(this->fGrammarPool,nameSpaceKey);
    local_28 = (GrammarResolver *)CONCAT44(extraout_var,iVar2);
    if (local_28 == (GrammarResolver *)0x0) {
      bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGrammarBucket,nameSpaceKey);
      if (bVar1) {
        local_28 = (GrammarResolver *)
                   RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::orphanKey
                             (this->fGrammarBucket,nameSpaceKey);
      }
    }
    else {
      bVar1 = RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::containsKey
                        (this->fGrammarFromPool,nameSpaceKey);
      if (bVar1) {
        RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::removeKey
                  (this->fGrammarFromPool,nameSpaceKey);
      }
    }
    this_local = local_28;
  }
  return (Grammar *)this_local;
}

Assistant:

Grammar* GrammarResolver::orphanGrammar(const XMLCh* const nameSpaceKey)
{
    if (fCacheGrammar)
    {
        Grammar* grammar = fGrammarPool->orphanGrammar(nameSpaceKey);
        if (grammar)
        {
            if (fGrammarFromPool->containsKey(nameSpaceKey))
                fGrammarFromPool->removeKey(nameSpaceKey);
        }
        // Check to see if it's in fGrammarBucket, since
        // we put it there if the grammar pool refused to
        // cache it.
        else if (fGrammarBucket->containsKey(nameSpaceKey))
        {
            grammar = fGrammarBucket->orphanKey(nameSpaceKey);
        }

        return grammar;
    }
    else
    {
        return fGrammarBucket->orphanKey(nameSpaceKey);
    }
}